

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_xsrqpi(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xb)

{
  uint8_t *puVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  float128 fVar7;
  float128 arg;
  uintptr_t unaff_retaddr;
  float_status tstat;
  float_status local_40;
  ppc_vsr_t *local_38;
  
  uVar3 = opcode >> 0x10 & 1;
  uVar5 = opcode >> 9 & 3;
  (env->fp_status).float_exception_flags = '\0';
  if (uVar3 == 0 && uVar5 == 0) {
    bVar2 = 4;
  }
  else if (uVar5 == 3 && uVar3 == 0) {
    bVar2 = (byte)env->fpscr & 3;
  }
  else if (uVar3 == 0) {
    bVar2 = 0;
  }
  else {
    bVar2 = (byte)(0x1020300 >> (sbyte)(uVar5 << 3));
  }
  local_40._0_2_ = CONCAT11(bVar2,(env->fp_status).float_detect_tininess);
  local_40 = (float_status)(CONCAT62(SUB86(env->fp_status,2),local_40._0_2_) & 0xffffffffff00ffff);
  local_38 = xt;
  fVar7 = float128_round_to_int_ppc(xb->f128,&local_40);
  uVar6 = fVar7.high;
  puVar1 = &(env->fp_status).float_exception_flags;
  *puVar1 = *puVar1 | local_40.float_exception_flags;
  if (((ulong)local_40 & 0x10000) != 0) {
    iVar4 = float128_is_signaling_nan_ppc(xb->f128,&local_40);
    if (iVar4 != 0) {
      float_invalid_op_vxsnan(env,unaff_retaddr);
      uVar6 = uVar6 | 0x800000000000;
    }
  }
  if (((opcode & 1) == 0) && (((ulong)local_40 & 0x200000) != 0)) {
    puVar1 = &(env->fp_status).float_exception_flags;
    *puVar1 = *puVar1 & 0xdf;
  }
  arg.high = uVar6;
  arg.low = fVar7.low;
  helper_compute_fprf_float128(env,arg);
  do_float_check_status(env,unaff_retaddr);
  local_38->u64[0] = fVar7.low;
  local_38->u64[1] = uVar6;
  return;
}

Assistant:

void helper_xsrqpi(CPUPPCState *env, uint32_t opcode,
                   ppc_vsr_t *xt, ppc_vsr_t *xb)
{
    ppc_vsr_t t = { 0 };
    uint8_t r = Rrm(opcode);
    uint8_t ex = Rc(opcode);
    uint8_t rmc = RMC(opcode);
    uint8_t rmode = 0;
    float_status tstat;

    helper_reset_fpstatus(env);

    if (r == 0 && rmc == 0) {
        rmode = float_round_ties_away;
    } else if (r == 0 && rmc == 0x3) {
        rmode = fpscr_rn;
    } else if (r == 1) {
        switch (rmc) {
        case 0:
            rmode = float_round_nearest_even;
            break;
        case 1:
            rmode = float_round_to_zero;
            break;
        case 2:
            rmode = float_round_up;
            break;
        case 3:
            rmode = float_round_down;
            break;
        default:
            abort();
        }
    }

    tstat = env->fp_status;
    set_float_exception_flags(0, &tstat);
    set_float_rounding_mode(rmode, &tstat);
    t.f128 = float128_round_to_int(xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        if (float128_is_signaling_nan(xb->f128, &tstat)) {
            float_invalid_op_vxsnan(env, GETPC());
            t.f128 = float128_snan_to_qnan(t.f128);
        }
    }

    if (ex == 0 && (tstat.float_exception_flags & float_flag_inexact)) {
        env->fp_status.float_exception_flags &= ~float_flag_inexact;
    }

    helper_compute_fprf_float128(env, t.f128);
    do_float_check_status(env, GETPC());
    *xt = t;
}